

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::writeSourceInfo(XmlReporter *this,SourceLineInfo *sourceInfo)

{
  allocator<char> local_69;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  char **in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  XmlWriter *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  XmlWriter::writeAttribute<char_const*>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (unsigned_long *)in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void XmlReporter::writeSourceInfo( SourceLineInfo const& sourceInfo ) {
        m_xml
            .writeAttribute( "filename", sourceInfo.file )
            .writeAttribute( "line", sourceInfo.line );
    }